

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep_io.c
# Opt level: O2

int ARKStepSetTables(void *arkode_mem,int q,int p,ARKodeButcherTable Bi,ARKodeButcherTable Be)

{
  int iVar1;
  ARKodeButcherTable pAVar2;
  int error_code;
  char *pcVar3;
  ARKodeMem ark_mem;
  ARKodeARKStepMem step_mem;
  sunindextype Blrw;
  sunindextype Bliw;
  
  iVar1 = arkStep_AccessStepMem(arkode_mem,"ARKStepSetTables",&ark_mem,&step_mem);
  if (iVar1 != 0) {
    return iVar1;
  }
  if (Bi == (ARKodeButcherTable)0x0 && Be == (ARKodeButcherTable)0x0) {
    pcVar3 = "At least one complete table must be supplied";
LAB_003a4e9d:
    arkProcessError(ark_mem,-0x15,"ARKode::ARKStep","ARKStepSetTables",pcVar3);
    return -0x16;
  }
  if ((Be != (ARKodeButcherTable)0x0 && Bi != (ARKodeButcherTable)0x0) && (Bi->stages != Be->stages)
     ) {
    pcVar3 = "Both tables must have the same number of stages";
    goto LAB_003a4e9d;
  }
  step_mem->stages = 0;
  step_mem->q = 0;
  step_mem->p = 0;
  ARKodeButcherTable_Space(step_mem->Be,&Bliw,&Blrw);
  ARKodeButcherTable_Free(step_mem->Be);
  step_mem->Be = (ARKodeButcherTable)0x0;
  ark_mem->liw = ark_mem->liw - (long)Bliw;
  ark_mem->lrw = ark_mem->lrw - (long)Blrw;
  ARKodeButcherTable_Space(step_mem->Bi,&Bliw,&Blrw);
  ARKodeButcherTable_Free(step_mem->Bi);
  step_mem->Bi = (ARKodeButcherTable)0x0;
  ark_mem->liw = ark_mem->liw - (long)Bliw;
  ark_mem->lrw = ark_mem->lrw - (long)Blrw;
  if (Bi == (ARKodeButcherTable)0x0) {
    step_mem->stages = Be->stages;
    iVar1 = Be->p;
    step_mem->q = Be->q;
    step_mem->p = iVar1;
    pAVar2 = ARKodeButcherTable_Copy(Be);
    step_mem->Be = pAVar2;
    if (pAVar2 != (ARKodeButcherTable)0x0) {
      iVar1 = ARKStepSetExplicit(arkode_mem);
      if (iVar1 == 0) {
LAB_003a50ce:
        ARKodeButcherTable_Space(step_mem->Be,&Bliw,&Blrw);
        ark_mem->liw = ark_mem->liw + (long)Bliw;
        ark_mem->lrw = ark_mem->lrw + (long)Blrw;
        ARKodeButcherTable_Space(step_mem->Bi,&Bliw,&Blrw);
        ark_mem->liw = ark_mem->liw + (long)Bliw;
        ark_mem->lrw = ark_mem->lrw + (long)Blrw;
        return 0;
      }
      pcVar3 = "Error in ARKStepSetExplicit";
      error_code = -0x16;
      goto LAB_003a50c5;
    }
  }
  else {
    step_mem->stages = Bi->stages;
    if (Be == (ARKodeButcherTable)0x0) {
      iVar1 = Bi->p;
      step_mem->q = Bi->q;
      step_mem->p = iVar1;
      pAVar2 = ARKodeButcherTable_Copy(Bi);
      step_mem->Bi = pAVar2;
      if (pAVar2 != (ARKodeButcherTable)0x0) {
        iVar1 = ARKStepSetImplicit(arkode_mem);
        if (iVar1 == 0) goto LAB_003a50ce;
        pcVar3 = "Error in ARKStepSetImplicit";
LAB_003a50a3:
        error_code = -0x16;
        iVar1 = error_code;
        goto LAB_003a50c5;
      }
    }
    else {
      step_mem->q = q;
      step_mem->p = p;
      pAVar2 = ARKodeButcherTable_Copy(Be);
      step_mem->Be = pAVar2;
      if (pAVar2 != (ARKodeButcherTable)0x0) {
        pAVar2 = ARKodeButcherTable_Copy(Bi);
        step_mem->Bi = pAVar2;
        if (pAVar2 != (ARKodeButcherTable)0x0) {
          iVar1 = ARKStepSetImEx(arkode_mem);
          if (iVar1 == 0) goto LAB_003a50ce;
          pcVar3 = "Error in ARKStepSetImEx";
          goto LAB_003a50a3;
        }
      }
    }
  }
  pcVar3 = "arkode_mem = NULL illegal.";
  error_code = -0x15;
  iVar1 = error_code;
LAB_003a50c5:
  arkProcessError(ark_mem,error_code,"ARKode::ARKStep","ARKStepSetTables",pcVar3);
  return iVar1;
}

Assistant:

int ARKStepSetTables(void *arkode_mem, int q, int p,
                     ARKodeButcherTable Bi, ARKodeButcherTable Be)
{
  int retval;
  ARKodeMem ark_mem;
  ARKodeARKStepMem step_mem;
  sunindextype Blrw, Bliw;

  /* access ARKodeARKStepMem structure */
  retval = arkStep_AccessStepMem(arkode_mem, "ARKStepSetTables",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  /* check for illegal inputs */
  if ((Bi == NULL) && (Be == NULL)) {
    arkProcessError(ark_mem, ARK_MEM_NULL, "ARKode::ARKStep",
                    "ARKStepSetTables",
                    "At least one complete table must be supplied");
    return(ARK_ILL_INPUT);
  }

  /* if both tables are set, check that they have the same number of stages */
  if ((Bi != NULL) && (Be != NULL)) {
    if (Bi->stages != Be->stages) {
      arkProcessError(ark_mem, ARK_MEM_NULL, "ARKode::ARKStep",
                      "ARKStepSetTables",
                      "Both tables must have the same number of stages");
      return(ARK_ILL_INPUT);
    }
  }

  /* clear any existing parameters and Butcher tables */
  step_mem->stages = 0;
  step_mem->q = 0;
  step_mem->p = 0;

  ARKodeButcherTable_Space(step_mem->Be, &Bliw, &Blrw);
  ARKodeButcherTable_Free(step_mem->Be);
  step_mem->Be = NULL;
  ark_mem->liw -= Bliw;
  ark_mem->lrw -= Blrw;

  ARKodeButcherTable_Space(step_mem->Bi, &Bliw, &Blrw);
  ARKodeButcherTable_Free(step_mem->Bi);
  step_mem->Bi = NULL;
  ark_mem->liw -= Bliw;
  ark_mem->lrw -= Blrw;

  /*
   * determine mode (implicit/explicit/ImEx), and perform appropriate actions
   */

  /* explicit */
  if (Bi == NULL) {

    /* set the relevant parameters (use table q and p) */
    step_mem->stages = Be->stages;
    step_mem->q = Be->q;
    step_mem->p = Be->p;

    /* copy the table in step memory */
    step_mem->Be = ARKodeButcherTable_Copy(Be);
    if (step_mem->Be == NULL) {
      arkProcessError(ark_mem, ARK_MEM_NULL, "ARKode::ARKStep",
                      "ARKStepSetTables", MSG_ARK_NO_MEM);
      return(ARK_MEM_NULL);
    }

    /* set method as purely explicit */
    retval = ARKStepSetExplicit(arkode_mem);
    if (retval != ARK_SUCCESS) {
      arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::ARKStep",
                      "ARKStepSetTables",
                      "Error in ARKStepSetExplicit");
      return(retval);
    }

  /* implicit */
  } else if (Be == NULL) {

    /* set the relevant parameters (use table q and p) */
    step_mem->stages = Bi->stages;
    step_mem->q = Bi->q;
    step_mem->p = Bi->p;

    /* copy the table in step memory */
    step_mem->Bi = ARKodeButcherTable_Copy(Bi);
    if (step_mem->Bi == NULL) {
      arkProcessError(ark_mem, ARK_MEM_NULL, "ARKode::ARKStep",
                      "ARKStepSetTables", MSG_ARK_NO_MEM);
      return(ARK_MEM_NULL);
    }

    /* set method as purely implicit */
    retval = ARKStepSetImplicit(arkode_mem);
    if (retval != ARK_SUCCESS) {
      arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::ARKStep",
                      "ARKStepSetTables",
                      "Error in ARKStepSetImplicit");
      return(ARK_ILL_INPUT);
    }

  /* ImEx */
  } else {

    /* set the relevant parameters (use input q and p) */
    step_mem->stages = Bi->stages;
    step_mem->q = q;
    step_mem->p = p;

    /* copy the explicit table into step memory */
    step_mem->Be = ARKodeButcherTable_Copy(Be);
    if (step_mem->Be == NULL) {
      arkProcessError(ark_mem, ARK_MEM_NULL, "ARKode::ARKStep",
                      "ARKStepSetTables", MSG_ARK_NO_MEM);
      return(ARK_MEM_NULL);
    }

    /* copy the implicit table into step memory */
    step_mem->Bi = ARKodeButcherTable_Copy(Bi);
    if (step_mem->Bi == NULL) {
      arkProcessError(ark_mem, ARK_MEM_NULL, "ARKode::ARKStep",
                      "ARKStepSetTables", MSG_ARK_NO_MEM);
      return(ARK_MEM_NULL);
    }

    /* set method as ImEx */
    retval = ARKStepSetImEx(arkode_mem);
    if (retval != ARK_SUCCESS) {
      arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::ARKStep",
                      "ARKStepSetTables",
                      "Error in ARKStepSetImEx");
      return(ARK_ILL_INPUT);
    }
  }

  /* note Butcher table space requirements */
  ARKodeButcherTable_Space(step_mem->Be, &Bliw, &Blrw);
  ark_mem->liw += Bliw;
  ark_mem->lrw += Blrw;

  ARKodeButcherTable_Space(step_mem->Bi, &Bliw, &Blrw);
  ark_mem->liw += Bliw;
  ark_mem->lrw += Blrw;

  return(ARK_SUCCESS);
}